

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O2

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  uv__io_s *puVar6;
  char cVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  uint64_t uVar15;
  undefined1 *puVar16;
  uint uVar17;
  char cVar18;
  uv__io_t *__event;
  ulong uVar19;
  char cVar20;
  bool bVar21;
  bool bVar22;
  uint local_30f4;
  int local_30e8;
  int local_30e4;
  epoll_event e;
  sigset_t sigset;
  epoll_event events [1024];
  
  if (loop->nfds == 0) {
    if (loop->watcher_queue == (void **)loop->watcher_queue[0]) {
      return;
    }
    __assert_fail("QUEUE_EMPTY(&loop->watcher_queue)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                  ,0x89,"void uv__io_poll(uv_loop_t *, int)");
  }
  e.data.u64._4_4_ = 0;
  e._0_8_ = 0;
  while (plVar2 = (long *)loop->watcher_queue[0], loop->watcher_queue != (void **)plVar2) {
    lVar3 = *plVar2;
    *(long *)plVar2[1] = lVar3;
    *(long *)(lVar3 + 8) = plVar2[1];
    *plVar2 = (long)plVar2;
    plVar2[1] = (long)plVar2;
    if (*(uint32_t *)(plVar2 + 2) == 0) {
      __assert_fail("w->pevents != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                    ,0x95,"void uv__io_poll(uv_loop_t *, int)");
    }
    iVar10 = (int)plVar2[3];
    if (iVar10 < 0) {
      __assert_fail("w->fd >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                    ,0x96,"void uv__io_poll(uv_loop_t *, int)");
    }
    if ((int)loop->nwatchers <= iVar10) {
      __assert_fail("w->fd < (int) loop->nwatchers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                    ,0x97,"void uv__io_poll(uv_loop_t *, int)");
    }
    e.data.fd = iVar10;
    e.events = *(uint32_t *)(plVar2 + 2);
    iVar1 = *(int *)((long)plVar2 + 0x14);
    iVar10 = epoll_ctl(loop->backend_fd,(uint)(iVar1 != 0) * 2 + 1,iVar10,(epoll_event *)&e);
    if (iVar10 != 0) {
      piVar14 = __errno_location();
      if (*piVar14 != 0x11) goto LAB_001873eb;
      if (iVar1 != 0) {
        __assert_fail("op == EPOLL_CTL_ADD",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                      ,0xa8,"void uv__io_poll(uv_loop_t *, int)");
      }
      iVar10 = epoll_ctl(loop->backend_fd,3,(int)plVar2[3],(epoll_event *)&e);
      if (iVar10 != 0) goto LAB_001873eb;
    }
    *(int *)((long)plVar2 + 0x14) = (int)plVar2[2];
  }
  uVar4 = loop->flags;
  if ((uVar4 & 1) != 0) {
    sigemptyset((sigset_t *)&sigset);
    sigaddset((sigset_t *)&sigset,0x1b);
  }
  if (timeout < -1) {
    __assert_fail("timeout >= -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                  ,0xb9,"void uv__io_poll(uv_loop_t *, int)");
  }
  uVar5 = loop->time;
  uVar11 = *loop->internal_fields & 1;
  uVar17 = -uVar11 & timeout;
  bVar22 = uVar11 == 0;
  uVar11 = 0;
  if (bVar22) {
    uVar11 = timeout;
  }
  local_30e4 = 0x30;
  cVar18 = uv__io_poll_no_epoll_pwait_cached;
  cVar20 = uv__io_poll_no_epoll_wait_cached;
  local_30f4 = timeout;
  while( true ) {
    if (uVar11 != 0) {
      uv__metrics_set_provider_entry_time(loop);
    }
    if ((((uVar4 & 1) != 0) && (cVar18 != '\0')) &&
       (iVar10 = pthread_sigmask(0,(__sigset_t *)&sigset,(__sigset_t *)0x0), iVar10 != 0)) break;
    if ((cVar20 == '\0') && ((cVar18 == '\0' & (byte)uVar4) == 0)) {
      uVar12 = epoll_wait(loop->backend_fd,(epoll_event *)events,0x400,uVar11);
      cVar20 = '\0';
      if (uVar12 == 0xffffffff) {
        piVar14 = __errno_location();
        iVar10 = *piVar14;
        puVar16 = &uv__io_poll_no_epoll_wait_cached;
        cVar7 = '\x01';
        cVar9 = cVar18;
joined_r0x001870f4:
        uVar12 = 0xffffffff;
        if (iVar10 == 0x26) {
          uVar12 = 0xffffffff;
          *puVar16 = 1;
          cVar18 = cVar9;
          cVar20 = cVar7;
        }
      }
    }
    else {
      uVar12 = epoll_pwait(loop->backend_fd,(epoll_event *)events,0x400,uVar11,(__sigset_t *)&sigset
                          );
      if (uVar12 == 0xffffffff) {
        piVar14 = __errno_location();
        iVar10 = *piVar14;
        puVar16 = &uv__io_poll_no_epoll_pwait_cached;
        cVar9 = '\x01';
        cVar7 = cVar20;
        goto joined_r0x001870f4;
      }
    }
    if ((((uVar4 & 1) != 0) && (cVar18 != '\0')) &&
       (iVar10 = pthread_sigmask(1,(__sigset_t *)&sigset,(__sigset_t *)0x0), iVar10 != 0)) break;
    piVar14 = __errno_location();
    iVar10 = *piVar14;
    uVar15 = uv__hrtime(UV_CLOCK_FAST);
    loop->time = uVar15 / 1000000;
    *piVar14 = iVar10;
    if (uVar12 == 0xffffffff) {
      if (iVar10 == 0x26) {
        if ((cVar20 != '\0') && (cVar18 != '\0')) {
          __assert_fail("no_epoll_wait == 0 || no_epoll_pwait == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                        ,0x117,"void uv__io_poll(uv_loop_t *, int)");
        }
      }
      else {
        if (iVar10 != 4) break;
LAB_00187358:
        if (!bVar22) {
          uVar11 = uVar17;
        }
joined_r0x00187341:
        bVar22 = true;
        if (uVar11 != 0xffffffff) {
          if (uVar11 == 0) {
            return;
          }
          if ((int)uVar11 < 1) {
            __assert_fail("timeout > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                          ,0x19d,"void uv__io_poll(uv_loop_t *, int)");
          }
          local_30f4 = local_30f4 + ((int)uVar5 - (int)loop->time);
          bVar22 = true;
          uVar11 = local_30f4;
          if ((int)local_30f4 < 1) {
            return;
          }
        }
      }
    }
    else {
      if (uVar12 == 0) {
        if (uVar11 == 0xffffffff) {
          __assert_fail("timeout != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                        ,0x101,"void uv__io_poll(uv_loop_t *, int)");
        }
        goto LAB_00187358;
      }
      if (loop->watchers == (uv__io_t **)0x0) {
        __assert_fail("loop->watchers != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                      ,0x138,"void uv__io_poll(uv_loop_t *, int)");
      }
      __event = (uv__io_t *)events;
      loop->watchers[loop->nwatchers] = __event;
      loop->watchers[loop->nwatchers + 1] = (uv__io_t *)(long)(int)uVar12;
      bVar8 = false;
      uVar19 = 0;
      if (0 < (int)uVar12) {
        uVar19 = (ulong)uVar12;
      }
      local_30e8 = 0;
      while (bVar21 = uVar19 != 0, uVar19 = uVar19 - 1, bVar21) {
        uVar13 = *(uint *)((long)&__event->cb + 4);
        if ((ulong)uVar13 != 0xffffffff) {
          if ((int)uVar13 < 0) {
            __assert_fail("fd >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                          ,0x145,"void uv__io_poll(uv_loop_t *, int)");
          }
          if (loop->nwatchers <= uVar13) {
            __assert_fail("(unsigned) fd < loop->nwatchers",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                          ,0x146,"void uv__io_poll(uv_loop_t *, int)");
          }
          puVar6 = loop->watchers[uVar13];
          if (puVar6 == (uv__io_s *)0x0) {
            epoll_ctl(loop->backend_fd,2,uVar13,(epoll_event *)__event);
          }
          else {
            uVar13 = (puVar6->pevents | 0x18) & *(uint *)&__event->cb;
            *(uint *)&__event->cb = uVar13;
            if (uVar13 != 0) {
              if ((uVar13 == 0x10) || (uVar13 == 8)) {
                *(uint *)&__event->cb = puVar6->pevents & 0x2007 | uVar13;
              }
              bVar21 = true;
              if (puVar6 != &loop->signal_io_watcher) {
                uv__metrics_update_idle_time(loop);
                (*puVar6->cb)(loop,puVar6,*(uint *)&__event->cb);
                bVar21 = bVar8;
              }
              local_30e8 = local_30e8 + 1;
              bVar8 = bVar21;
            }
          }
        }
        __event = (uv__io_t *)((long)__event->pending_queue + 4);
      }
      if (!bVar22) {
        uVar11 = uVar17;
      }
      if (bVar8) {
        uv__metrics_update_idle_time(loop);
        (*(loop->signal_io_watcher).cb)(loop,&loop->signal_io_watcher,1);
      }
      loop->watchers[loop->nwatchers] = (uv__io_t *)0x0;
      loop->watchers[loop->nwatchers + 1] = (uv__io_t *)0x0;
      if (bVar8) {
        return;
      }
      if (local_30e8 == 0) goto joined_r0x00187341;
      if (uVar12 != 0x400) {
        return;
      }
      uVar11 = 0;
      bVar22 = true;
      local_30e4 = local_30e4 + -1;
      if (local_30e4 == 0) {
        return;
      }
    }
  }
LAB_001873eb:
  abort();
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  /* A bug in kernels < 2.6.37 makes timeouts larger than ~30 minutes
   * effectively infinite on 32 bits architectures.  To avoid blocking
   * indefinitely, we cap the timeout and poll again if necessary.
   *
   * Note that "30 minutes" is a simplification because it depends on
   * the value of CONFIG_HZ.  The magic constant assumes CONFIG_HZ=1200,
   * that being the largest value I have seen in the wild (and only once.)
   */
  static const int max_safe_timeout = 1789569;
  static int no_epoll_pwait_cached;
  static int no_epoll_wait_cached;
  int no_epoll_pwait;
  int no_epoll_wait;
  struct epoll_event events[1024];
  struct epoll_event* pe;
  struct epoll_event e;
  int real_timeout;
  QUEUE* q;
  uv__io_t* w;
  sigset_t sigset;
  uint64_t sigmask;
  uint64_t base;
  int have_signals;
  int nevents;
  int count;
  int nfds;
  int fd;
  int op;
  int i;
  int user_timeout;
  int reset_timeout;

  if (loop->nfds == 0) {
    assert(QUEUE_EMPTY(&loop->watcher_queue));
    return;
  }

  memset(&e, 0, sizeof(e));

  while (!QUEUE_EMPTY(&loop->watcher_queue)) {
    q = QUEUE_HEAD(&loop->watcher_queue);
    QUEUE_REMOVE(q);
    QUEUE_INIT(q);

    w = QUEUE_DATA(q, uv__io_t, watcher_queue);
    assert(w->pevents != 0);
    assert(w->fd >= 0);
    assert(w->fd < (int) loop->nwatchers);

    e.events = w->pevents;
    e.data.fd = w->fd;

    if (w->events == 0)
      op = EPOLL_CTL_ADD;
    else
      op = EPOLL_CTL_MOD;

    /* XXX Future optimization: do EPOLL_CTL_MOD lazily if we stop watching
     * events, skip the syscall and squelch the events after epoll_wait().
     */
    if (epoll_ctl(loop->backend_fd, op, w->fd, &e)) {
      if (errno != EEXIST)
        abort();

      assert(op == EPOLL_CTL_ADD);

      /* We've reactivated a file descriptor that's been watched before. */
      if (epoll_ctl(loop->backend_fd, EPOLL_CTL_MOD, w->fd, &e))
        abort();
    }

    w->events = w->pevents;
  }

  sigmask = 0;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    sigmask |= 1 << (SIGPROF - 1);
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  if (uv__get_internal_fields(loop)->flags & UV_METRICS_IDLE_TIME) {
    reset_timeout = 1;
    user_timeout = timeout;
    timeout = 0;
  } else {
    reset_timeout = 0;
    user_timeout = 0;
  }

  /* You could argue there is a dependency between these two but
   * ultimately we don't care about their ordering with respect
   * to one another. Worst case, we make a few system calls that
   * could have been avoided because another thread already knows
   * they fail with ENOSYS. Hardly the end of the world.
   */
  no_epoll_pwait = uv__load_relaxed(&no_epoll_pwait_cached);
  no_epoll_wait = uv__load_relaxed(&no_epoll_wait_cached);

  for (;;) {
    /* Only need to set the provider_entry_time if timeout != 0. The function
     * will return early if the loop isn't configured with UV_METRICS_IDLE_TIME.
     */
    if (timeout != 0)
      uv__metrics_set_provider_entry_time(loop);

    /* See the comment for max_safe_timeout for an explanation of why
     * this is necessary.  Executive summary: kernel bug workaround.
     */
    if (sizeof(int32_t) == sizeof(long) && timeout >= max_safe_timeout)
      timeout = max_safe_timeout;

    if (sigmask != 0 && no_epoll_pwait != 0)
      if (pthread_sigmask(SIG_BLOCK, &sigset, NULL))
        abort();

    if (no_epoll_wait != 0 || (sigmask != 0 && no_epoll_pwait == 0)) {
      nfds = epoll_pwait(loop->backend_fd,
                         events,
                         ARRAY_SIZE(events),
                         timeout,
                         &sigset);
      if (nfds == -1 && errno == ENOSYS) {
        uv__store_relaxed(&no_epoll_pwait_cached, 1);
        no_epoll_pwait = 1;
      }
    } else {
      nfds = epoll_wait(loop->backend_fd,
                        events,
                        ARRAY_SIZE(events),
                        timeout);
      if (nfds == -1 && errno == ENOSYS) {
        uv__store_relaxed(&no_epoll_wait_cached, 1);
        no_epoll_wait = 1;
      }
    }

    if (sigmask != 0 && no_epoll_pwait != 0)
      if (pthread_sigmask(SIG_UNBLOCK, &sigset, NULL))
        abort();

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == 0) {
      assert(timeout != -1);

      if (reset_timeout != 0) {
        timeout = user_timeout;
        reset_timeout = 0;
      }

      if (timeout == -1)
        continue;

      if (timeout == 0)
        return;

      /* We may have been inside the system call for longer than |timeout|
       * milliseconds so we need to update the timestamp to avoid drift.
       */
      goto update_timeout;
    }

    if (nfds == -1) {
      if (errno == ENOSYS) {
        /* epoll_wait() or epoll_pwait() failed, try the other system call. */
        assert(no_epoll_wait == 0 || no_epoll_pwait == 0);
        continue;
      }

      if (errno != EINTR)
        abort();

      if (reset_timeout != 0) {
        timeout = user_timeout;
        reset_timeout = 0;
      }

      if (timeout == -1)
        continue;

      if (timeout == 0)
        return;

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_signals = 0;
    nevents = 0;

    {
      /* Squelch a -Waddress-of-packed-member warning with gcc >= 9. */
      union {
        struct epoll_event* events;
        uv__io_t* watchers;
      } x;

      x.events = events;
      assert(loop->watchers != NULL);
      loop->watchers[loop->nwatchers] = x.watchers;
      loop->watchers[loop->nwatchers + 1] = (void*) (uintptr_t) nfds;
    }

    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data.fd;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         */
        epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |=
          w->pevents & (POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher) {
          have_signals = 1;
        } else {
          uv__metrics_update_idle_time(loop);
          w->cb(loop, w, pe->events);
        }

        nevents++;
      }
    }

    if (reset_timeout != 0) {
      timeout = user_timeout;
      reset_timeout = 0;
    }

    if (have_signals != 0) {
      uv__metrics_update_idle_time(loop);
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);
    }

    loop->watchers[loop->nwatchers] = NULL;
    loop->watchers[loop->nwatchers + 1] = NULL;

    if (have_signals != 0)
      return;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      return;
    }

    if (timeout == 0)
      return;

    if (timeout == -1)
      continue;

update_timeout:
    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      return;

    timeout = real_timeout;
  }
}